

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_paged_audio_buffer_seek_to_pcm_frame
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 frameIndex)

{
  ma_result mVar1;
  ulong uVar2;
  ma_paged_audio_buffer_page *pmVar3;
  ma_uint64 mVar4;
  ulong uVar5;
  ma_paged_audio_buffer_page *pmVar6;
  bool bVar7;
  
  if (pPagedAudioBuffer == (ma_paged_audio_buffer *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    uVar2 = pPagedAudioBuffer->absoluteCursor;
    mVar1 = MA_SUCCESS;
    if (uVar2 != frameIndex) {
      if (frameIndex < uVar2) {
        pmVar3 = &pPagedAudioBuffer->pData->head;
        if (pPagedAudioBuffer->pData == (ma_paged_audio_buffer_data *)0x0) {
          pmVar3 = (ma_paged_audio_buffer_page *)0x0;
        }
        pPagedAudioBuffer->pCurrent = pmVar3;
        pPagedAudioBuffer->relativeCursor = 0;
        pPagedAudioBuffer->absoluteCursor = 0;
        uVar2 = 0;
      }
      if (uVar2 < frameIndex) {
        pmVar3 = &pPagedAudioBuffer->pData->head;
        if (pPagedAudioBuffer->pData == (ma_paged_audio_buffer_data *)0x0) {
          pmVar3 = (ma_paged_audio_buffer_page *)0x0;
        }
        uVar2 = 0;
        do {
          do {
            do {
              pmVar3 = pmVar3->pNext;
              if (pmVar3 == (ma_paged_audio_buffer_page *)0x0) {
                return MA_BAD_SEEK;
              }
              uVar5 = pmVar3->sizeInFrames + uVar2;
              bVar7 = frameIndex < uVar2;
              mVar4 = frameIndex - uVar2;
              uVar2 = uVar5;
            } while (bVar7);
            if (frameIndex < uVar5) goto LAB_0014864c;
          } while (uVar5 != frameIndex);
          if (pPagedAudioBuffer->pData == (ma_paged_audio_buffer_data *)0x0) {
            pmVar6 = (ma_paged_audio_buffer_page *)0x0;
          }
          else {
            pmVar6 = pPagedAudioBuffer->pData->pTail;
          }
        } while (pmVar3 != pmVar6->pNext);
LAB_0014864c:
        pPagedAudioBuffer->pCurrent = pmVar3;
        pPagedAudioBuffer->absoluteCursor = frameIndex;
        pPagedAudioBuffer->relativeCursor = mVar4;
        return MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_seek_to_pcm_frame(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64 frameIndex)
{
    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    if (frameIndex == pPagedAudioBuffer->absoluteCursor) {
        return MA_SUCCESS;  /* Nothing to do. */
    }

    if (frameIndex < pPagedAudioBuffer->absoluteCursor) {
        /* Moving backwards. Need to move the cursor back to the start, and then move forward. */
        pPagedAudioBuffer->pCurrent       = ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData);
        pPagedAudioBuffer->absoluteCursor = 0;
        pPagedAudioBuffer->relativeCursor = 0;

        /* Fall through to the forward seeking section below. */
    }

    if (frameIndex > pPagedAudioBuffer->absoluteCursor) {
        /* Moving forward. */
        ma_paged_audio_buffer_page* pPage;
        ma_uint64 runningCursor = 0;

        for (pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData)->pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext)) {
            ma_uint64 pageRangeBeg = runningCursor;
            ma_uint64 pageRangeEnd = pageRangeBeg + pPage->sizeInFrames;

            if (frameIndex >= pageRangeBeg) {
                if (frameIndex < pageRangeEnd || (frameIndex == pageRangeEnd && pPage == (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(ma_paged_audio_buffer_data_get_tail(pPagedAudioBuffer->pData)))) {  /* A small edge case - allow seeking to the very end of the buffer. */
                    /* We found the page. */
                    pPagedAudioBuffer->pCurrent       = pPage;
                    pPagedAudioBuffer->absoluteCursor = frameIndex;
                    pPagedAudioBuffer->relativeCursor = frameIndex - pageRangeBeg;
                    return MA_SUCCESS;
                }
            }

            runningCursor = pageRangeEnd;
        }

        /* Getting here means we tried seeking too far forward. Don't change any state. */
        return MA_BAD_SEEK;
    }

    return MA_SUCCESS;
}